

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O3

uint32_t __thiscall HvFile::allocpath(HvFile *this,HKEY root,uint32_t parent,string *path)

{
  pointer psVar1;
  undefined8 uVar2;
  key *this_00;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  element_type *peVar8;
  shared_ptr<ent::base> local_40;
  
  this_00 = (key *)operator_new(0x80);
  ent::key::key(this_00,(uint32_t)
                        ((ulong)((long)(this->_items).
                                       super__Vector_base<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->_items).
                                      super__Vector_base<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4),path);
  local_40.super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ent::key*>
            (&local_40.super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>._M_refcount,this_00
            );
  std::vector<std::shared_ptr<ent::base>,std::allocator<std::shared_ptr<ent::base>>>::
  emplace_back<std::shared_ptr<ent::base>>
            ((vector<std::shared_ptr<ent::base>,std::allocator<std::shared_ptr<ent::base>>> *)
             &this->_items,&local_40);
  if (local_40.super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  uVar5 = ((this->_items).
           super__Vector_base<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_id & 0xfffffff;
  if (parent == 0) {
    psVar1 = (this->_items).
             super__Vector_base<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar8 = psVar1[this->_rootid].super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lVar3 = __dynamic_cast(peVar8,&ent::base::typeinfo,&ent::roots::typeinfo,0);
    uVar7 = (ulong)root & 0xff;
    uVar6 = *(uint *)(*(long *)(lVar3 + 0x60) + uVar7 * 4);
    if ((uVar6 & 0xfffffff) == 0) {
      *(uint *)(*(long *)(lVar3 + 0x48) + uVar7 * 4) = uVar5 + 0x20000000;
      peVar8 = psVar1[this->_rootid].super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    }
    else {
      lVar3 = __dynamic_cast(*(undefined8 *)
                              ((long)&(psVar1->
                                      super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>).
                                      _M_ptr + (ulong)(uVar6 << 4)),&ent::base::typeinfo,
                             &ent::key::typeinfo,0);
      iVar4 = uVar5 + 0x20000000;
      if (uVar5 == 0) {
        iVar4 = 0;
      }
      *(int *)(lVar3 + 0x48) = iVar4;
    }
    lVar3 = __dynamic_cast(peVar8,&ent::base::typeinfo,&ent::roots::typeinfo,0);
    *(uint *)(*(long *)(lVar3 + 0x60) + uVar7 * 4) = uVar5 + 0x20000000;
  }
  else {
    psVar1 = (this->_items).
             super__Vector_base<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = psVar1[parent].super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lVar3 = __dynamic_cast(uVar2,&ent::base::typeinfo,&ent::key::typeinfo,0);
    if ((*(uint *)(lVar3 + 0x58) & 0xfffffff) == 0) {
      uVar6 = uVar5 + 0x20000000;
      if (uVar5 == 0) {
        uVar6 = uVar5;
      }
      *(uint *)(lVar3 + 0x4c) = uVar6;
    }
    else {
      lVar3 = __dynamic_cast(*(undefined8 *)
                              ((long)&(psVar1->
                                      super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>).
                                      _M_ptr + (ulong)(*(uint *)(lVar3 + 0x58) << 4)),
                             &ent::base::typeinfo,&ent::key::typeinfo,0);
      uVar6 = uVar5 + 0x20000000;
      if (uVar5 == 0) {
        uVar6 = uVar5;
      }
      *(uint *)(lVar3 + 0x48) = uVar6;
    }
    lVar3 = __dynamic_cast(uVar2,&ent::base::typeinfo,&ent::key::typeinfo,0);
    *(uint *)(lVar3 + 0x58) = uVar6;
  }
  return uVar5;
}

Assistant:

uint32_t allocpath(HKEY root, uint32_t parent, const std::string& path)
    {
        _items.push_back(ent::entry_ptr(new ent::key(_items.size(), path)));
        uint32_t id= _items.back()->id();

        if (parent) {
            uint32_t lkey= _items[parent]->askey()->lastchild();
            if (!lkey)
                _items[parent]->askey()->firstchild(id);
            else
                _items[lkey]->askey()->nextsibling(id);
            _items[parent]->askey()->lastchild(id);
        }
        else {
            uint32_t rkey= _items[_rootid]->asroots()->lasthivekey(root);
            if (!rkey)
                _items[_rootid]->asroots()->hiveid(root, id);
            else 
                _items[rkey]->askey()->nextsibling(id);
            _items[_rootid]->asroots()->lasthivekey(root, id);
        }

        return id;
    }